

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

string * __thiscall
testing::(anonymous_namespace)::FormatTimes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int n)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "twice";
  }
  else {
    if (iVar2 != 1) {
      std::__cxx11::stringstream::stringstream(asStack_198);
      poVar1 = (ostream *)std::ostream::operator<<(local_188,iVar2);
      std::operator<<(poVar1," times");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(asStack_198);
      return __return_storage_ptr__;
    }
    pcVar3 = "once";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)asStack_198);
  return __return_storage_ptr__;
}

Assistant:

inline internal::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}